

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O0

void solver_garbage_collect(solver_t *s)

{
  cdb *src;
  uint uVar1;
  uint uVar2;
  cdb *dest;
  watch_list *pwVar3;
  watcher *pwVar4;
  uint *puVar5;
  watcher *local_30;
  watcher *w;
  cdb *new_cdb;
  uint *array;
  uint i;
  solver_t *s_local;
  
  uVar1 = cdb_capacity(s->all_clauses);
  uVar2 = cdb_wasted(s->all_clauses);
  dest = cdb_alloc(uVar1 - uVar2);
  if (s->book_cdb != 0) {
    s->book_cdb = 0;
  }
  array._4_4_ = 0;
  while( true ) {
    uVar1 = vec_char_size(s->assigns);
    if (uVar1 << 1 <= array._4_4_) break;
    pwVar3 = vec_wl_at(s->watches,array._4_4_);
    local_30 = watch_list_array(pwVar3);
    while( true ) {
      pwVar3 = vec_wl_at(s->watches,array._4_4_);
      pwVar4 = watch_list_array(pwVar3);
      pwVar3 = vec_wl_at(s->watches,array._4_4_);
      uVar1 = watch_list_size(pwVar3);
      if (pwVar4 + uVar1 <= local_30) break;
      clause_realloc(dest,s->all_clauses,&local_30->cref);
      local_30 = local_30 + 1;
    }
    array._4_4_ = array._4_4_ + 1;
  }
  array._4_4_ = 0;
  while( true ) {
    uVar1 = vec_uint_size(s->trail);
    if (uVar1 <= array._4_4_) break;
    uVar1 = vec_uint_at(s->trail,array._4_4_);
    uVar1 = lit_reason(s,uVar1);
    if (uVar1 != 0xffffffff) {
      src = s->all_clauses;
      puVar5 = vec_uint_data(s->reasons);
      uVar1 = vec_uint_at(s->trail,array._4_4_);
      uVar1 = lit2var(uVar1);
      clause_realloc(dest,src,puVar5 + uVar1);
    }
    array._4_4_ = array._4_4_ + 1;
  }
  puVar5 = vec_uint_data(s->learnts);
  array._4_4_ = 0;
  while( true ) {
    uVar1 = vec_uint_size(s->learnts);
    if (uVar1 <= array._4_4_) break;
    clause_realloc(dest,s->all_clauses,puVar5 + array._4_4_);
    array._4_4_ = array._4_4_ + 1;
  }
  puVar5 = vec_uint_data(s->originals);
  array._4_4_ = 0;
  while( true ) {
    uVar1 = vec_uint_size(s->originals);
    if (uVar1 <= array._4_4_) break;
    clause_realloc(dest,s->all_clauses,puVar5 + array._4_4_);
    array._4_4_ = array._4_4_ + 1;
  }
  cdb_free(s->all_clauses);
  s->all_clauses = dest;
  return;
}

Assistant:

static inline void solver_garbage_collect(solver_t *s)
{
    unsigned i;
    unsigned *array;
    struct cdb *new_cdb = cdb_alloc(cdb_capacity(s->all_clauses) - cdb_wasted(s->all_clauses));

    if (s->book_cdb)
        s->book_cdb = 0;

    for (i = 0; i < 2 * vec_char_size(s->assigns); i++) {
        struct watcher *w;
        watch_list_foreach(s->watches, w, i)
            clause_realloc(new_cdb, s->all_clauses, &(w->cref));
    }

    /* Update CREFS */
    for (i = 0; i < vec_uint_size(s->trail); i++)
        if (lit_reason(s, vec_uint_at(s->trail, i)) != UNDEF)
            clause_realloc(new_cdb, s->all_clauses, &(vec_uint_data(s->reasons)[lit2var(vec_uint_at(s->trail, i))]));

    array = vec_uint_data(s->learnts);
    for (i = 0; i < vec_uint_size(s->learnts); i++)
        clause_realloc(new_cdb, s->all_clauses, &(array[i]));

    array = vec_uint_data(s->originals);
    for (i = 0; i < vec_uint_size(s->originals); i++)
        clause_realloc(new_cdb, s->all_clauses, &(array[i]));

    cdb_free(s->all_clauses);
    s->all_clauses = new_cdb;
}